

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O1

Tag * __thiscall jaegertracing::thrift::Tag::operator=(Tag *this,Tag *other2)

{
  std::__cxx11::string::_M_assign((string *)&this->key);
  this->vType = other2->vType;
  std::__cxx11::string::_M_assign((string *)&this->vStr);
  this->vDouble = other2->vDouble;
  this->vBool = other2->vBool;
  this->vLong = other2->vLong;
  std::__cxx11::string::_M_assign((string *)&this->vBinary);
  this->__isset = other2->__isset;
  return this;
}

Assistant:

Tag& Tag::operator=(const Tag& other2) {
  key = other2.key;
  vType = other2.vType;
  vStr = other2.vStr;
  vDouble = other2.vDouble;
  vBool = other2.vBool;
  vLong = other2.vLong;
  vBinary = other2.vBinary;
  __isset = other2.__isset;
  return *this;
}